

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O1

int32 ngram_model_set_add_ug(ngram_model_t *base,int32 wid,int32 lweight)

{
  int iVar1;
  ngram_model_t *model;
  char *word;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  void *ptr;
  logmath_t *plVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int32 logb_x;
  float64 fVar10;
  int32 n_hist;
  int32 local_48;
  int32 local_34;
  
  ptr = __ckd_calloc__((long)base[1].refcount,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                       ,0x31a);
  logb_x = base->log_zero;
  if (0 < base[1].refcount) {
    uVar8 = 0;
    do {
      iVar4 = logb_x;
      if ((ulong)*(uint *)&base[1].field_0x4 == 0xffffffff || uVar8 == *(uint *)&base[1].field_0x4)
      {
        iVar3 = ngram_wid(*(ngram_model_t **)(base[1].n_counts + uVar8 * 2),base->word_str[wid]);
        *(int32 *)((long)ptr + uVar8 * 4) = iVar3;
        if (iVar3 == -1) {
          model = *(ngram_model_t **)(base[1].n_counts + uVar8 * 2);
          word = base->word_str[wid];
          fVar10 = logmath_exp(base->lmath,lweight);
          iVar3 = ngram_model_add_word(model,word,(float32)(float)(double)fVar10);
          *(int32 *)((long)ptr + uVar8 * 4) = iVar3;
          if (iVar3 == -1) {
            ckd_free(ptr);
            local_48 = base->log_zero;
            bVar2 = false;
            goto LAB_0012f327;
          }
        }
        iVar3 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + uVar8 * 2),
                              *(int32 *)((long)ptr + uVar8 * 4),(int32 *)0x0,0,&local_34);
        bVar2 = true;
        iVar4 = iVar3;
        if ((uVar8 != *(uint *)&base[1].field_0x4) &&
           (iVar4 = logb_x, *(uint *)&base[1].field_0x4 == 0xffffffff)) {
          iVar4 = logmath_add(base->lmath,logb_x,iVar3 + *(int *)(*(long *)&base[1].n + uVar8 * 4));
        }
      }
      else {
        *(undefined4 *)((long)ptr + uVar8 * 4) = 0xffffffff;
        bVar2 = true;
      }
LAB_0012f327:
      logb_x = iVar4;
      if (!bVar2) {
        return local_48;
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)base[1].refcount);
  }
  plVar5 = (logmath_t *)
           __ckd_realloc__(base[1].lmath,(long)base->n_words << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x341);
  base[1].lmath = plVar5;
  pvVar6 = __ckd_realloc__((plVar5->t).table,(long)base[1].refcount * (long)base->n_words * 4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x344);
  ((base[1].lmath)->t).table = pvVar6;
  iVar4 = base->n_words;
  if (0 < (long)iVar4) {
    iVar1 = base[1].refcount;
    lVar7 = 0;
    lVar9 = 0;
    do {
      (&((base[1].lmath)->t).table)[lVar9] = (void *)((long)((base[1].lmath)->t).table + lVar7);
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + (long)iVar1 * 4;
    } while (iVar4 != lVar9);
  }
  memcpy((&((base[1].lmath)->t).table)[wid],ptr,(long)base[1].refcount << 2);
  ckd_free(ptr);
  return logb_x;
}

Assistant:

static int32
ngram_model_set_add_ug(ngram_model_t * base, int32 wid, int32 lweight)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 *newwid;
    int32 i, prob;

    /* At this point the word has already been added to the master
       model and we have a new word ID for it.  Add it to active
       submodels and track the word IDs. */
    newwid = ckd_calloc(set->n_models, sizeof(*newwid));
    prob = base->log_zero;
    for (i = 0; i < set->n_models; ++i) {
        int32 wprob, n_hist;

        /* Only add to active models. */
        if (set->cur == -1 || set->cur == i) {
            /* Did this word already exist? */
            newwid[i] = ngram_wid(set->lms[i], base->word_str[wid]);
            if (newwid[i] == NGRAM_INVALID_WID) {
                /* Add it to the submodel. */
                newwid[i] =
                    ngram_model_add_word(set->lms[i], base->word_str[wid],
                                         (float32) logmath_exp(base->lmath,
                                                               lweight));
                if (newwid[i] == NGRAM_INVALID_WID) {
                    ckd_free(newwid);
                    return base->log_zero;
                }
            }
            /* Now get the unigram probability for the new word and either
             * interpolate it or use it (if this is the current model). */
            wprob =
                ngram_ng_prob(set->lms[i], newwid[i], NULL, 0, &n_hist);
            if (set->cur == i)
                prob = wprob;
            else if (set->cur == -1)
                prob =
                    logmath_add(base->lmath, prob,
                                set->lweights[i] + wprob);
        }
        else {
            newwid[i] = NGRAM_INVALID_WID;
        }
    }
    /* Okay we have the word IDs for this in all the submodels.  Now
       do some complicated memory mangling to add this to the
       widmap. */
    set->widmap =
        ckd_realloc(set->widmap, base->n_words * sizeof(*set->widmap));
    set->widmap[0] =
        ckd_realloc(set->widmap[0],
                    base->n_words * set->n_models * sizeof(**set->widmap));
    for (i = 0; i < base->n_words; ++i)
        set->widmap[i] = set->widmap[0] + i * set->n_models;
    memcpy(set->widmap[wid], newwid, set->n_models * sizeof(*newwid));
    ckd_free(newwid);
    return prob;
}